

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O3

SRes crnlib::LzmaEnc_SetProps(CLzmaEncHandle pp,CLzmaEncProps *props2)

{
  SRes SVar1;
  uint uVar2;
  CLzmaEncProps props;
  CLzmaEncProps local_48;
  
  local_48.level = props2->level;
  local_48.dictSize = props2->dictSize;
  local_48.lc = props2->lc;
  local_48.lp = props2->lp;
  local_48.pb = props2->pb;
  local_48.algo = props2->algo;
  local_48.fb = props2->fb;
  local_48.btMode = props2->btMode;
  local_48.numHashBytes = props2->numHashBytes;
  local_48.mc = props2->mc;
  local_48.writeEndMark = props2->writeEndMark;
  local_48.numThreads = props2->numThreads;
  LzmaEncProps_Normalize(&local_48);
  SVar1 = 5;
  if ((local_48.dictSize < 0x40000001 && local_48.pb < 5) && (local_48.lp < 5 && local_48.lc < 9)) {
    *(UInt32 *)((long)pp + 0x3d350) = local_48.dictSize;
    *(UInt32 *)((long)pp + 0x3d354) = local_48.mc;
    uVar2 = 5;
    if (5 < (uint)local_48.fb) {
      uVar2 = local_48.fb;
    }
    if (0x110 < uVar2) {
      uVar2 = 0x111;
    }
    *(uint *)((long)pp + 0x32f68) = uVar2;
    *(int *)((long)pp + 0x33bcc) = local_48.lc;
    *(int *)((long)pp + 0x33bd0) = local_48.lp;
    *(int *)((long)pp + 0x33bd4) = local_48.pb;
    *(uint *)((long)pp + 0x3d2e0) = (uint)(local_48.algo == 0);
    *(int *)((long)pp + 0xa0) = local_48.btMode;
    if (local_48.btMode == 0) {
      uVar2 = 4;
    }
    else {
      uVar2 = 2;
      if ((1 < local_48.numHashBytes) && (uVar2 = 4, (uint)local_48.numHashBytes < 4)) {
        uVar2 = local_48.numHashBytes;
      }
    }
    *(uint *)((long)pp + 0x98) = uVar2;
    *(UInt32 *)((long)pp + 0x74) = local_48.mc;
    *(uint *)((long)pp + 0x3d330) = local_48.writeEndMark;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SRes LzmaEnc_SetProps(CLzmaEncHandle pp, const CLzmaEncProps* props2) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  CLzmaEncProps props = *props2;
  LzmaEncProps_Normalize(&props);

  if (props.lc > LZMA_LC_MAX ||
      props.lp > LZMA_LP_MAX ||
      props.pb > LZMA_PB_MAX ||
      props.dictSize > (1U << kDicLogSizeMaxCompress) ||
      props.dictSize > (1 << 30))
    return SZ_ERROR_PARAM;
  p->dictSize = props.dictSize;
  p->matchFinderCycles = props.mc;
  {
    unsigned fb = props.fb;
    if (fb < 5)
      fb = 5;
    if (fb > LZMA_MATCH_LEN_MAX)
      fb = LZMA_MATCH_LEN_MAX;
    p->numFastBytes = fb;
  }
  p->lc = props.lc;
  p->lp = props.lp;
  p->pb = props.pb;
  p->fastMode = (props.algo == 0);
  p->matchFinderBase.btMode = props.btMode;
  {
    UInt32 numHashBytes = 4;
    if (props.btMode) {
      if (props.numHashBytes < 2)
        numHashBytes = 2;
      else if (props.numHashBytes < 4)
        numHashBytes = props.numHashBytes;
    }
    p->matchFinderBase.numHashBytes = numHashBytes;
  }

  p->matchFinderBase.cutValue = props.mc;

  p->writeEndMark = props.writeEndMark;

#ifdef COMPRESS_MF_MT
  /*
  if (newMultiThread != _multiThread)
  {
    ReleaseMatchFinder();
    _multiThread = newMultiThread;
  }
  */
  p->multiThread = (props.numThreads > 1);
#endif

  return SZ_OK;
}